

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)1,_false> *this)

{
  FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *this_00;
  
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00124880;
  this_00 = &this->fixedVariableHeader;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             &this_00->super_FixedFieldGeneric,&(this->props).super_SerializableProperties,
             &(this->payload).super_SerializablePayload);
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00124880;
  (this->header).super_FixedHeaderBase.typeAndFlags = '\x10';
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_00124930;
  FixedField<(Protocol::MQTT::Common::ControlPacketType)1>::FixedField(this_00);
  Properties::Properties(&this->props);
  Payload<(Protocol::MQTT::Common::ControlPacketType)1>::Payload(&this->payload);
  (this->payload).fixedHeader = this_00;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }